

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O0

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  uint uVar1;
  int iVar2;
  BYTE *oend_00;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  size_t newSize;
  size_t oldSize;
  size_t hSize;
  size_t _var_err__;
  size_t maxBits;
  size_t largest;
  BYTE *op;
  BYTE *oend;
  BYTE *ostart;
  HUF_compress_tables_t *table;
  uint huffLog_local;
  uint maxSymbolValue_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstSize_local;
  void *dst_local;
  
  oend_00 = (BYTE *)((long)dst + dstSize);
  if (((ulong)workSpace & 3) == 0) {
    if (wkspSize < 0x1800) {
      dst_local = (void *)0xffffffffffffffbe;
    }
    else if (srcSize == 0) {
      dst_local = (void *)0x0;
    }
    else if (dstSize == 0) {
      dst_local = (void *)0x0;
    }
    else if (srcSize < 0x20001) {
      if (huffLog < 0xd) {
        if (maxSymbolValue < 0x100) {
          table._4_4_ = maxSymbolValue;
          if (maxSymbolValue == 0) {
            table._4_4_ = 0xff;
          }
          table._0_4_ = huffLog;
          if (huffLog == 0) {
            table._0_4_ = 0xb;
          }
          _huffLog_local = (void *)srcSize;
          srcSize_local = (size_t)src;
          src_local = (void *)dstSize;
          dstSize_local = (size_t)dst;
          if (((preferRepeat == 0) || (repeat == (HUF_repeat *)0x0)) ||
             (*repeat != HUF_repeat_valid)) {
            pvVar3 = (void *)HIST_count_wksp((uint *)workSpace,(uint *)((long)&table + 4),src,
                                             srcSize,workSpace,wkspSize);
            uVar1 = ERR_isError((size_t)pvVar3);
            dst_local = pvVar3;
            if (uVar1 == 0) {
              if (pvVar3 == _huffLog_local) {
                *(undefined1 *)dst = *(undefined1 *)srcSize_local;
                dst_local = (void *)0x1;
              }
              else if ((void *)(((ulong)_huffLog_local >> 7) + 4) < pvVar3) {
                if (((repeat != (HUF_repeat *)0x0) && (*repeat == HUF_repeat_check)) &&
                   (iVar2 = HUF_validateCTable(oldHufTable,(uint *)workSpace,table._4_4_),
                   iVar2 == 0)) {
                  *repeat = HUF_repeat_none;
                }
                if (((preferRepeat == 0) || (repeat == (HUF_repeat *)0x0)) ||
                   (*repeat == HUF_repeat_none)) {
                  table._0_4_ = HUF_optimalTableLog((uint)table,(size_t)_huffLog_local,table._4_4_);
                  pvVar3 = (void *)HUF_buildCTable_wksp
                                             ((HUF_CElt *)((long)workSpace + 0x400),
                                              (uint *)workSpace,table._4_4_,(uint)table,
                                              (void *)((long)workSpace + 0x800),0x1000);
                  uVar1 = ERR_isError((size_t)pvVar3);
                  dst_local = pvVar3;
                  if (uVar1 == 0) {
                    table._0_4_ = (uint)pvVar3;
                    memset((void *)((long)workSpace + (ulong)(table._4_4_ + 1) * 4 + 0x400),0,
                           (ulong)(table._4_4_ + 1) * -4 + 0x400);
                    pvVar3 = (void *)HUF_writeCTable(dst,(size_t)src_local,
                                                     (HUF_CElt *)((long)workSpace + 0x400),
                                                     table._4_4_,(uint)table);
                    uVar1 = ERR_isError((size_t)pvVar3);
                    dst_local = pvVar3;
                    if (uVar1 == 0) {
                      if ((repeat != (HUF_repeat *)0x0) && (*repeat != HUF_repeat_none)) {
                        sVar4 = HUF_estimateCompressedSize
                                          (oldHufTable,(uint *)workSpace,table._4_4_);
                        sVar5 = HUF_estimateCompressedSize
                                          ((HUF_CElt *)((long)workSpace + 0x400),(uint *)workSpace,
                                           table._4_4_);
                        if ((sVar4 <= (long)pvVar3 + sVar5) ||
                           (_huffLog_local <= (void *)((long)pvVar3 + 0xcU))) {
                          sVar4 = HUF_compressCTable_internal
                                            ((BYTE *)dst,(BYTE *)dst,oend_00,(void *)srcSize_local,
                                             (size_t)_huffLog_local,nbStreams,oldHufTable,bmi2);
                          return sVar4;
                        }
                      }
                      if ((void *)((long)pvVar3 + 0xcU) < _huffLog_local) {
                        if (repeat != (HUF_repeat *)0x0) {
                          *repeat = HUF_repeat_none;
                        }
                        if (oldHufTable != (HUF_CElt *)0x0) {
                          memcpy(oldHufTable,(void *)((long)workSpace + 0x400),0x400);
                        }
                        dst_local = (void *)HUF_compressCTable_internal
                                                      ((BYTE *)dst,
                                                       (BYTE *)((long)pvVar3 + (long)dst),oend_00,
                                                       (void *)srcSize_local,(size_t)_huffLog_local,
                                                       nbStreams,
                                                       (HUF_CElt *)((long)workSpace + 0x400),bmi2);
                      }
                      else {
                        dst_local = (void *)0x0;
                      }
                    }
                  }
                }
                else {
                  dst_local = (void *)HUF_compressCTable_internal
                                                ((BYTE *)dst,(BYTE *)dst,oend_00,
                                                 (void *)srcSize_local,(size_t)_huffLog_local,
                                                 nbStreams,oldHufTable,bmi2);
                }
              }
              else {
                dst_local = (void *)0x0;
              }
            }
          }
          else {
            dst_local = (void *)HUF_compressCTable_internal
                                          ((BYTE *)dst,(BYTE *)dst,oend_00,src,srcSize,nbStreams,
                                           oldHufTable,bmi2);
          }
        }
        else {
          dst_local = (void *)0xffffffffffffffd2;
        }
      }
      else {
        dst_local = (void *)0xffffffffffffffd4;
      }
    }
    else {
      dst_local = (void *)0xffffffffffffffb8;
    }
  }
  else {
    dst_local = (void *)0xffffffffffffffff;
  }
  return (size_t)dst_local;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                 const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    /* checks & inits */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < HUF_WORKSPACE_SIZE) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, workSpace, wkspSize) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            table->nodeTable, sizeof(table->nodeTable));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable (op, dstSize, table->CTable, maxSymbolValue, huffLog) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, bmi2);
}